

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

bool __thiscall
cmComputeTargetDepends::IntraComponent
          (cmComputeTargetDepends *this,vector<int,_std::allocator<int>_> *cmap,int c,int i,
          int *head,set<int,_std::less<int>,_std::allocator<int>_> *emitted,
          set<int,_std::less<int>,_std::allocator<int>_> *visited)

{
  int i_00;
  pointer pcVar1;
  bool bVar2;
  long lVar3;
  pointer pcVar4;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar5;
  int local_4c;
  int *local_48;
  cmGraphEdge local_40;
  set<int,_std::less<int>,_std::allocator<int>_> *local_38;
  
  local_4c = i;
  local_48 = head;
  pVar5 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     visited,&local_4c);
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_003caa3a:
    bVar2 = false;
  }
  else {
    pVar5 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       emitted,&local_4c);
    bVar2 = true;
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      lVar3 = (long)local_4c;
      pcVar1 = (this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_38 = emitted;
      for (pcVar4 = *(pointer *)
                     &pcVar1[lVar3].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
          pcVar4 != *(pointer *)
                     ((long)&pcVar1[lVar3].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                             super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
          pcVar4 = pcVar4 + 1) {
        i_00 = pcVar4->Dest;
        if (((cmap->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start[i_00] == c) && (pcVar4->Strong == true)) {
          local_40.Strong = true;
          local_40.Dest = i_00;
          std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::emplace_back<cmGraphEdge>
                    (&(this->FinalGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start[local_4c].
                      super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,&local_40);
          bVar2 = IntraComponent(this,cmap,c,i_00,local_48,local_38,visited);
          if (!bVar2) goto LAB_003caa3a;
        }
      }
      local_40.Dest = *local_48;
      if (local_40.Dest < 0) {
        (this->ComponentTail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[c] = local_4c;
      }
      else {
        local_40.Strong = false;
        std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::emplace_back<cmGraphEdge>
                  (&(this->FinalGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start[local_4c].
                    super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,&local_40);
      }
      *local_48 = local_4c;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool cmComputeTargetDepends::IntraComponent(std::vector<int> const& cmap,
                                            int c, int i, int* head,
                                            std::set<int>& emitted,
                                            std::set<int>& visited)
{
  if (!visited.insert(i).second) {
    // Cycle in utility depends!
    return false;
  }
  if (emitted.insert(i).second) {
    // Honor strong intra-component edges in the final order.
    EdgeList const& el = this->InitialGraph[i];
    for (EdgeList::const_iterator ei = el.begin(); ei != el.end(); ++ei) {
      int j = *ei;
      if (cmap[j] == c && ei->IsStrong()) {
        this->FinalGraph[i].push_back(cmGraphEdge(j, true));
        if (!this->IntraComponent(cmap, c, j, head, emitted, visited)) {
          return false;
        }
      }
    }

    // Prepend to a linear linked-list of intra-component edges.
    if (*head >= 0) {
      this->FinalGraph[i].push_back(cmGraphEdge(*head, false));
    } else {
      this->ComponentTail[c] = i;
    }
    *head = i;
  }
  return true;
}